

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

VP8StatusCode VP8EnterCritical(VP8Decoder *dec,VP8Io *io)

{
  byte bVar1;
  int iVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  VP8FInfo (*paVVar6) [2];
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  if ((io->setup != (VP8IoSetupHook)0x0) && (iVar2 = (*io->setup)(io), iVar2 == 0)) {
    VP8SetError(dec,VP8_STATUS_USER_ABORT,"Frame setup failed");
    return dec->status_;
  }
  if (io->bypass_filtering != 0) {
    dec->filter_type_ = 0;
  }
  iVar2 = dec->filter_type_;
  bVar1 = ""[iVar2];
  if ((long)iVar2 == 2) {
    dec->tl_mb_x_ = 0;
  }
  else {
    iVar5 = (int)(io->crop_left - (uint)bVar1) >> 4;
    dec->tl_mb_x_ = iVar5;
    iVar4 = (int)(io->crop_top - (uint)bVar1) >> 4;
    dec->tl_mb_y_ = iVar4;
    if (iVar5 < 0) {
      dec->tl_mb_x_ = 0;
    }
    if (-1 < iVar4) goto LAB_00131434;
  }
  dec->tl_mb_y_ = 0;
LAB_00131434:
  iVar5 = (int)(io->crop_bottom + bVar1 + 0xf) >> 4;
  dec->br_mb_y_ = iVar5;
  iVar4 = (int)(bVar1 + 0xf + io->crop_right) >> 4;
  if (dec->mb_w_ <= iVar4) {
    iVar4 = dec->mb_w_;
  }
  dec->br_mb_x_ = iVar4;
  if (dec->mb_h_ < iVar5) {
    dec->br_mb_y_ = dec->mb_h_;
  }
  if (0 < iVar2) {
    iVar2 = (dec->filter_hdr_).use_lf_delta_;
    iVar4 = (dec->segment_hdr_).use_segment_;
    paVVar6 = dec->fstrengths_;
    lVar7 = 0;
    do {
      if (iVar4 == 0) {
        uVar8 = (dec->filter_hdr_).level_;
      }
      else {
        uVar8 = (uint)(dec->segment_hdr_).filter_strength_[lVar7];
        if ((dec->segment_hdr_).absolute_delta_ == 0) {
          uVar8 = uVar8 + (dec->filter_hdr_).level_;
        }
      }
      lVar9 = 0;
      do {
        uVar10 = uVar8;
        if ((iVar2 != 0) && (uVar10 = (dec->filter_hdr_).ref_lf_delta_[0] + uVar8, lVar9 != 0)) {
          uVar10 = uVar10 + (dec->filter_hdr_).mode_lf_delta_[0];
        }
        uVar11 = 0x3f;
        if ((int)uVar10 < 0x3f) {
          uVar11 = uVar10;
        }
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        if ((int)uVar10 < 1) {
          (*paVVar6)[lVar9].f_limit_ = '\0';
        }
        else {
          iVar5 = (dec->filter_hdr_).sharpness_;
          uVar12 = uVar11;
          if (0 < iVar5) {
            uVar12 = uVar11 >> (4 < iVar5) + 1;
            if ((int)(9U - iVar5) <= (int)uVar12) {
              uVar12 = 9U - iVar5;
            }
          }
          if ((int)uVar12 < 2) {
            uVar12 = 1;
          }
          (*paVVar6)[lVar9].f_ilevel_ = (uint8_t)uVar12;
          (*paVVar6)[lVar9].f_limit_ = (uint8_t)uVar12 + (char)uVar11 * '\x02';
          uVar3 = 0xe < (int)uVar10;
          if (0x27 < (int)uVar10) {
            uVar3 = '\x02';
          }
          (*paVVar6)[lVar9].hev_thresh_ = uVar3;
        }
        (*paVVar6)[lVar9].f_inner_ = (uint8_t)lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      lVar7 = lVar7 + 1;
      paVVar6 = paVVar6 + 1;
    } while (lVar7 != 4);
  }
  return VP8_STATUS_OK;
}

Assistant:

VP8StatusCode VP8EnterCritical(VP8Decoder* const dec, VP8Io* const io) {
  // Call setup() first. This may trigger additional decoding features on 'io'.
  // Note: Afterward, we must call teardown() no matter what.
  if (io->setup != NULL && !io->setup(io)) {
    VP8SetError(dec, VP8_STATUS_USER_ABORT, "Frame setup failed");
    return dec->status_;
  }

  // Disable filtering per user request
  if (io->bypass_filtering) {
    dec->filter_type_ = 0;
  }

  // Define the area where we can skip in-loop filtering, in case of cropping.
  //
  // 'Simple' filter reads two luma samples outside of the macroblock
  // and filters one. It doesn't filter the chroma samples. Hence, we can
  // avoid doing the in-loop filtering before crop_top/crop_left position.
  // For the 'Complex' filter, 3 samples are read and up to 3 are filtered.
  // Means: there's a dependency chain that goes all the way up to the
  // top-left corner of the picture (MB #0). We must filter all the previous
  // macroblocks.
  {
    const int extra_pixels = kFilterExtraRows[dec->filter_type_];
    if (dec->filter_type_ == 2) {
      // For complex filter, we need to preserve the dependency chain.
      dec->tl_mb_x_ = 0;
      dec->tl_mb_y_ = 0;
    } else {
      // For simple filter, we can filter only the cropped region.
      // We include 'extra_pixels' on the other side of the boundary, since
      // vertical or horizontal filtering of the previous macroblock can
      // modify some abutting pixels.
      dec->tl_mb_x_ = (io->crop_left - extra_pixels) >> 4;
      dec->tl_mb_y_ = (io->crop_top - extra_pixels) >> 4;
      if (dec->tl_mb_x_ < 0) dec->tl_mb_x_ = 0;
      if (dec->tl_mb_y_ < 0) dec->tl_mb_y_ = 0;
    }
    // We need some 'extra' pixels on the right/bottom.
    dec->br_mb_y_ = (io->crop_bottom + 15 + extra_pixels) >> 4;
    dec->br_mb_x_ = (io->crop_right + 15 + extra_pixels) >> 4;
    if (dec->br_mb_x_ > dec->mb_w_) {
      dec->br_mb_x_ = dec->mb_w_;
    }
    if (dec->br_mb_y_ > dec->mb_h_) {
      dec->br_mb_y_ = dec->mb_h_;
    }
  }
  PrecomputeFilterStrengths(dec);
  return VP8_STATUS_OK;
}